

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamWriterPrivate::CreatePackedCigar
          (BamWriterPrivate *this,
          vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *cigarOperations,
          string *packedCigar)

{
  bool bVar1;
  pointer pCVar2;
  undefined8 uVar3;
  ulong in_RDX;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_RSI;
  string message;
  uint8_t cigarOp;
  const_iterator coEnd;
  const_iterator coIter;
  uint *pPackedCigar;
  size_t numCigarOperations;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_ffffffffffffff18;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  *in_stack_ffffffffffffff20;
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  allocator *paVar4;
  allocator local_b9;
  string local_b8 [8];
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  BamException *in_stack_ffffffffffffff60;
  allocator local_81;
  string local_80 [71];
  byte local_39;
  CigarOp *local_38;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_30;
  uint *local_28;
  size_type local_20;
  ulong local_18;
  
  local_18 = in_RDX;
  local_20 = std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::size(in_RSI);
  std::__cxx11::string::resize(local_18);
  local_28 = (uint *)std::__cxx11::string::data();
  local_30._M_current =
       (CigarOp *)
       std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                 (in_stack_ffffffffffffff18);
  local_38 = (CigarOp *)
             std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                       (in_stack_ffffffffffffff18);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff20,
                            (__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                             *)in_stack_ffffffffffffff18), bVar1) {
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
             ::operator->(&local_30);
    switch(pCVar2->Type) {
    case '=':
      local_39 = 7;
      break;
    default:
      std::allocator<char>::allocator();
      __rhs = (char)((ulong)in_stack_ffffffffffffff20 >> 0x38);
      std::__cxx11::string::string(local_80,"invalid CIGAR operation type",&local_81);
      __gnu_cxx::
      __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
      ::operator->(&local_30);
      std::operator+(in_stack_ffffffffffffff28,__rhs);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      uVar3 = __cxa_allocate_exception(0x28);
      paVar4 = &local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"BamWriter::CreatePackedCigar",paVar4);
      BamException::BamException
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
    case 'D':
      local_39 = 2;
      break;
    case 'H':
      local_39 = 5;
      break;
    case 'I':
      local_39 = 1;
      break;
    case 'M':
      local_39 = 0;
      break;
    case 'N':
      local_39 = 3;
      break;
    case 'P':
      local_39 = 6;
      break;
    case 'S':
      local_39 = 4;
      break;
    case 'X':
      local_39 = 8;
    }
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
             ::operator->(&local_30);
    *local_28 = pCVar2->Length << 4 | (uint)local_39;
    local_28 = local_28 + 1;
    __gnu_cxx::
    __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void BamWriterPrivate::CreatePackedCigar(const std::vector<CigarOp>& cigarOperations,
                                         std::string& packedCigar)
{

    // initialize
    const std::size_t numCigarOperations = cigarOperations.size();
    packedCigar.resize(numCigarOperations * Constants::BAM_SIZEOF_INT);

    // pack the cigar data into the string
    unsigned int* pPackedCigar = (unsigned int*)packedCigar.data();

    // iterate over cigar operations
    std::vector<CigarOp>::const_iterator coIter = cigarOperations.begin();
    std::vector<CigarOp>::const_iterator coEnd = cigarOperations.end();
    for (; coIter != coEnd; ++coIter) {

        // store op in packedCigar
        uint8_t cigarOp;
        switch (coIter->Type) {
            case (Constants::BAM_CIGAR_MATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_MATCH;
                break;
            case (Constants::BAM_CIGAR_INS_CHAR):
                cigarOp = Constants::BAM_CIGAR_INS;
                break;
            case (Constants::BAM_CIGAR_DEL_CHAR):
                cigarOp = Constants::BAM_CIGAR_DEL;
                break;
            case (Constants::BAM_CIGAR_REFSKIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_REFSKIP;
                break;
            case (Constants::BAM_CIGAR_SOFTCLIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_SOFTCLIP;
                break;
            case (Constants::BAM_CIGAR_HARDCLIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_HARDCLIP;
                break;
            case (Constants::BAM_CIGAR_PAD_CHAR):
                cigarOp = Constants::BAM_CIGAR_PAD;
                break;
            case (Constants::BAM_CIGAR_SEQMATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_SEQMATCH;
                break;
            case (Constants::BAM_CIGAR_MISMATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_MISMATCH;
                break;
            default:
                const std::string message =
                    std::string("invalid CIGAR operation type") + coIter->Type;
                throw BamException("BamWriter::CreatePackedCigar", message);
        }

        *pPackedCigar = coIter->Length << Constants::BAM_CIGAR_SHIFT | cigarOp;
        pPackedCigar++;
    }
}